

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiletime_test.cpp
# Opt level: O2

void operations_test<viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>,viennamath::ct_variable<0ul>>
               (rt_constant<long,_viennamath::rt_expression_interface<double>_> *t,
               ct_variable<0UL> *u,double t2,double u2)

{
  ostream *poVar1;
  type local_40;
  double local_20;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"LHS: ");
  poVar1 = viennamath::operator<<(poVar1,t);
  std::operator<<(poVar1," (");
  poVar1 = std::ostream::_M_insert<double>(t2);
  poVar1 = std::operator<<(poVar1,"), RHS: ");
  poVar1 = viennamath::operator<<(poVar1,u);
  std::operator<<(poVar1,"(");
  poVar1 = std::ostream::_M_insert<double>(u2);
  poVar1 = std::operator<<(poVar1,")");
  std::endl<char,std::char_traits<char>>(poVar1);
  viennamath::result_of::
  add<viennamath::rt_constant<long,_viennamath::rt_expression_interface<double>_>,_viennamath::ct_variable<0UL>,_false,_true>
  ::instance(&local_40,t,u);
  local_20 = t2 + u2;
  evaluations_test<viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>>>
            (&local_40,local_20);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_40);
  viennamath::result_of::
  add<viennamath::ct_variable<0UL>,_viennamath::rt_constant<long,_viennamath::rt_expression_interface<double>_>,_true,_false>
  ::instance(&local_40,u,t);
  evaluations_test<viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>>>
            (&local_40,local_20);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_40);
  viennamath::result_of::
  subtract<viennamath::rt_constant<long,_viennamath::rt_expression_interface<double>_>,_viennamath::ct_variable<0UL>,_false,_true>
  ::instance(&local_40,t,u);
  evaluations_test<viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>>>
            (&local_40,t2 - u2);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_40);
  viennamath::result_of::
  subtract<viennamath::ct_variable<0UL>,_viennamath::rt_constant<long,_viennamath::rt_expression_interface<double>_>,_true,_false>
  ::instance(&local_40,u,t);
  evaluations_test<viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>>>
            (&local_40,u2 - t2);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_40);
  viennamath::result_of::
  mult<viennamath::rt_constant<long,_viennamath::rt_expression_interface<double>_>,_viennamath::ct_variable<0UL>,_false,_true>
  ::instance(&local_40,t,u);
  local_20 = t2 * u2;
  evaluations_test<viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>>>
            (&local_40,local_20);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_40);
  viennamath::result_of::
  mult<viennamath::ct_variable<0UL>,_viennamath::rt_constant<long,_viennamath::rt_expression_interface<double>_>,_true,_false>
  ::instance(&local_40,u,t);
  evaluations_test<viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>>>
            (&local_40,local_20);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_40);
  viennamath::result_of::
  div<viennamath::rt_constant<long,_viennamath::rt_expression_interface<double>_>,_viennamath::ct_variable<0UL>,_false,_true>
  ::instance(&local_40,t,u);
  evaluations_test<viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>>>
            (&local_40,t2 / u2);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_40);
  viennamath::result_of::
  div<viennamath::ct_variable<0UL>,_viennamath::rt_constant<long,_viennamath::rt_expression_interface<double>_>,_true,_false>
  ::instance(&local_40,u,t);
  evaluations_test<viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>>>
            (&local_40,u2 / t2);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_40);
  return;
}

Assistant:

void operations_test(T const & t, U const & u, double t2, double u2)
{
  std::cout << "LHS: " << t << " (" << t2 << "), RHS: " << u << "(" << u2 << ")" << std::endl;
  evaluations_test(t + u, t2 + u2);
  evaluations_test(u + t, u2 + t2);
  evaluations_test(t - u, t2 - u2);
  evaluations_test(u - t, u2 - t2);
  evaluations_test(t * u, t2 * u2);
  evaluations_test(u * t, u2 * t2);
  evaluations_test(t / u, t2 / u2);
  evaluations_test(u / t, u2 / t2);
}